

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * __thiscall
QUtil::read_file_into_string_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,char *filename)

{
  FileCloser this_00;
  char *in_R8;
  string_view filename_00;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  FileCloser local_28;
  FileCloser fc;
  FILE *f;
  char *filename_local;
  
  fc.f = safe_fopen((char *)this,"rb");
  FileCloser::FileCloser(&local_28,fc.f);
  this_00.f = fc.f;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,(char *)this);
  filename_00._M_str = in_R8;
  filename_00._M_len = (size_t)local_38._M_str;
  read_file_into_string_abi_cxx11_
            (__return_storage_ptr__,(QUtil *)this_00.f,(FILE *)local_38._M_len,filename_00);
  FileCloser::~FileCloser(&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::read_file_into_string(char const* filename)
{
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    return read_file_into_string(f, filename);
}